

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long *local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    pcVar7 = "no surjection from elements to requirements exists such that:\n";
    lVar8 = 0x3e;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        lVar8 = *(long *)(this + 8);
        lVar6 = *(long *)(this + 0x10);
        if (lVar8 == lVar6) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"isn\'t empty",0xb);
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"doesn\'t have ",0xd);
        if (lVar6 - lVar8 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)&local_60,1);
          Message::GetString_abi_cxx11_(&local_50,(Message *)&local_60);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_50._M_dataplus._M_p,local_50._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", or has ",9);
          Elements((UnorderedElementsAreMatcherImplBase *)&local_58,1);
          Message::GetString_abi_cxx11_(&local_50,(Message *)&local_58);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," that ",6);
          if (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = IsTrue(true);
            if ((bVar3) &&
               (local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_58.ptr_ + 8))();
            }
            local_58.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          if (local_60 != (long *)0x0) {
            bVar3 = IsTrue(true);
            if ((bVar3) && (local_60 != (long *)0x0)) {
              (**(code **)(*local_60 + 8))();
            }
            local_60 = (long *)0x0;
          }
          (**(code **)(*(long *)**(undefined8 **)(this + 8) + 0x18))
                    ((long *)**(undefined8 **)(this + 8),os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)&local_60,
                 *(long *)(this + 0x10) - *(long *)(this + 8) >> 3);
        Message::GetString_abi_cxx11_(&local_50,(Message *)&local_60);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,", or there exists no permutation of elements such that:\n",0x38);
        if (local_60 != (long *)0x0) {
          bVar3 = IsTrue(true);
          if ((bVar3) && (local_60 != (long *)0x0)) {
            (**(code **)(*local_60 + 8))();
          }
          local_60 = (long *)0x0;
        }
      }
      goto LAB_0012d16e;
    }
    pcVar7 = "no injection from elements to requirements exists such that:\n";
    lVar8 = 0x3d;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar8);
LAB_0012d16e:
  if (*(long *)(this + 0x10) != *(long *)(this + 8)) {
    pcVar7 = "";
    lVar8 = 0;
    do {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,sVar5);
      if (*(int *)this == 3) {
        std::__ostream_insert<char,std::char_traits<char>>(os," - element #",0xc);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        lVar6 = 1;
        pcVar7 = " ";
      }
      else {
        lVar6 = 0xe;
        pcVar7 = " - an element ";
        poVar4 = os;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
      plVar2 = *(long **)(*(long *)(this + 8) + lVar8 * 8);
      (**(code **)(*plVar2 + 0x10))(plVar2,os);
      pcVar7 = "\n";
      if (*(int *)this == 3) {
        pcVar7 = ", and\n";
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != *(long *)(this + 0x10) - *(long *)(this + 8) >> 3);
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "isn't empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "doesn't have " << Elements(1) << ", or has " << Elements(1)
            << " that ";
        matcher_describers_[0]->DescribeNegationTo(os);
        return;
      }
      *os << "doesn't have " << Elements(matcher_describers_.size())
          << ", or there exists no permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "no surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "no injection from elements to requirements exists such that:\n";
      break;
  }
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}